

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

void __thiscall
asio::execution::detail::any_executor_base::any_executor_base(any_executor_base *this)

{
  object_fns *poVar1;
  target_fns *ptVar2;
  long in_RDI;
  
  poVar1 = object_fns_table<void>((type *)0x0);
  *(object_fns **)(in_RDI + 0x18) = poVar1;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  ptVar2 = target_fns_table<void>((type *)0x0);
  *(target_fns **)(in_RDI + 0x28) = ptVar2;
  return;
}

Assistant:

any_executor_base() ASIO_NOEXCEPT
    : object_fns_(object_fns_table<void>()),
      target_(0),
      target_fns_(target_fns_table<void>())
  {
  }